

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testXdr.cpp
# Opt level: O0

void anon_unknown.dwarf_23dc62::check<long>(istream *is,long c)

{
  char *pcVar1;
  ostream *poVar2;
  void *this;
  basic_istream<char,_std::char_traits<char>_> *in_RSI;
  long v;
  basic_istream<char,_std::char_traits<char>_> *in_stack_ffffffffffffffe8;
  
  Imf_3_2::Xdr::read<(anonymous_namespace)::CharIO,std::istream>
            (in_RSI,(int64_t *)in_stack_ffffffffffffffe8);
  pcVar1 = std::type_info::name((type_info *)&long::typeinfo);
  poVar2 = std::operator<<((ostream *)&std::cout,pcVar1);
  poVar2 = std::operator<<(poVar2,": expected ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(long)in_RSI);
  poVar2 = std::operator<<(poVar2,", got ");
  this = (void *)std::ostream::operator<<(poVar2,(long)in_stack_ffffffffffffffe8);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  if (in_RSI == in_stack_ffffffffffffffe8) {
    return;
  }
  __assert_fail("c == v",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testXdr.cpp"
                ,99,"void (anonymous namespace)::check(istream &, T) [T = long]");
}

Assistant:

void
check (istream& is, T c)
{
    T v;

    Xdr::read<CharIO> (is, v);
    cout << typeid (v).name () << ": expected " << c << ", got " << v << endl;
    assert (c == v);
}